

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O2

void fld_export(uint8_t *dst,limb_t *src)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  fld_t tmp;
  limb_t local_38 [6];
  
  fld_reduce(local_38,src);
  uVar3 = 0;
  iVar2 = 0;
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    uVar3 = uVar3 | local_38[lVar1] << ((byte)iVar2 & 0x3f);
    for (iVar2 = iVar2 + 0x33; 7 < iVar2; iVar2 = iVar2 + -8) {
      *dst = (uint8_t)uVar3;
      dst = dst + 1;
      uVar3 = uVar3 >> 8;
    }
  }
  *dst = (uint8_t)uVar3;
  return;
}

Assistant:

void
fld_export(uint8_t dst[32], const fld_t src)
{
	int i;
	fld_t tmp;
	uint64_t foo = 0;
	int fill = 0;
	
	fld_reduce(tmp, src);

	for (i = 0; i < FLD_LIMB_NUM; i++) {
		foo |= (uint64_t)tmp[i] << fill;
		for (fill += FLD_LIMB_BITS; fill >= 8; fill -= 8, foo >>= 8)
			*dst++ = foo & 0xff;
	}
	*dst++ = foo & 0xff;
}